

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O2

void atomic(lua_State *L)

{
  global_State *g;
  GCObject *pGVar1;
  GCObject *pGVar2;
  lua_State *plVar3;
  UpVal *pUVar4;
  anon_union_16_2_5131162a_for_u *paVar5;
  lua_State **pplVar6;
  
  g = L->l_G;
  pGVar1 = g->grayagain;
  g->grayagain = (GCObject *)0x0;
  g->gcstate = '\x02';
  if ((L->marked & 0x18) != 0) {
    reallymarkobject(g,(GCObject *)L);
  }
  if ((((g->l_registry).tt_ & 0x40) != 0) &&
     (pGVar2 = (g->l_registry).value_.gc, (pGVar2->marked & 0x18) != 0)) {
    reallymarkobject(g,pGVar2);
  }
  markmt(g);
  propagateall(g);
  pplVar6 = &g->twups;
  while (plVar3 = *pplVar6, plVar3 != (lua_State *)0x0) {
    if (((plVar3->marked & 0x18) == 0) && (plVar3->openupval != (UpVal *)0x0)) {
      pplVar6 = &plVar3->twups;
    }
    else {
      *pplVar6 = plVar3->twups;
      plVar3->twups = plVar3;
      paVar5 = (anon_union_16_2_5131162a_for_u *)&plVar3->openupval;
      while (pUVar4 = (paVar5->open).next, pUVar4 != (UpVal *)0x0) {
        if ((((pUVar4->marked & 0x18) == 0) && ((((pUVar4->v).p)->tt_ & 0x40) != 0)) &&
           (pGVar2 = (((pUVar4->v).p)->value_).gc, (pGVar2->marked & 0x18) != 0)) {
          reallymarkobject(g,pGVar2);
        }
        paVar5 = &pUVar4->u;
      }
    }
  }
  propagateall(g);
  g->gray = pGVar1;
  propagateall(g);
  convergeephemerons(g);
  clearbyvalues(g,g->weak,(GCObject *)0x0);
  clearbyvalues(g,g->allweak,(GCObject *)0x0);
  pGVar1 = g->weak;
  pGVar2 = g->allweak;
  separatetobefnz(g,0);
  markbeingfnz(g);
  propagateall(g);
  convergeephemerons(g);
  clearbykeys(g,g->ephemeron);
  clearbykeys(g,g->allweak);
  clearbyvalues(g,g->weak,pGVar1);
  clearbyvalues(g,g->allweak,pGVar2);
  luaS_clearcache(g);
  g->currentwhite = g->currentwhite ^ 0x18;
  return;
}

Assistant:

static void atomic (lua_State *L) {
  global_State *g = G(L);
  GCObject *origweak, *origall;
  GCObject *grayagain = g->grayagain;  /* save original list */
  g->grayagain = NULL;
  lua_assert(g->ephemeron == NULL && g->weak == NULL);
  lua_assert(!iswhite(mainthread(g)));
  g->gcstate = GCSatomic;
  markobject(g, L);  /* mark running thread */
  /* registry and global metatables may be changed by API */
  markvalue(g, &g->l_registry);
  markmt(g);  /* mark global metatables */
  propagateall(g);  /* empties 'gray' list */
  /* remark occasional upvalues of (maybe) dead threads */
  remarkupvals(g);
  propagateall(g);  /* propagate changes */
  g->gray = grayagain;
  propagateall(g);  /* traverse 'grayagain' list */
  convergeephemerons(g);
  /* at this point, all strongly accessible objects are marked. */
  /* Clear values from weak tables, before checking finalizers */
  clearbyvalues(g, g->weak, NULL);
  clearbyvalues(g, g->allweak, NULL);
  origweak = g->weak; origall = g->allweak;
  separatetobefnz(g, 0);  /* separate objects to be finalized */
  markbeingfnz(g);  /* mark objects that will be finalized */
  propagateall(g);  /* remark, to propagate 'resurrection' */
  convergeephemerons(g);
  /* at this point, all resurrected objects are marked. */
  /* remove dead objects from weak tables */
  clearbykeys(g, g->ephemeron);  /* clear keys from all ephemeron */
  clearbykeys(g, g->allweak);  /* clear keys from all 'allweak' */
  /* clear values from resurrected weak tables */
  clearbyvalues(g, g->weak, origweak);
  clearbyvalues(g, g->allweak, origall);
  luaS_clearcache(g);
  g->currentwhite = cast_byte(otherwhite(g));  /* flip current white */
  lua_assert(g->gray == NULL);
}